

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall defyx::JitCompilerX86::h_ISUB_R(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint32_t val;
  int in_EDX;
  long in_RSI;
  JitCompilerX86 *in_RDI;
  uint8_t (*in_stack_ffffffffffffffd8) [2];
  
  in_RDI->registerUsage[*(byte *)(in_RSI + 1)] = in_EDX;
  if (*(char *)(in_RSI + 2) == *(char *)(in_RSI + 1)) {
    emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
    emitByte(in_RDI,*(char *)(in_RSI + 1) + 0xe8);
    val = Instruction::getImm32((Instruction *)0x1441d5);
    emit32(in_RDI,val);
  }
  else {
    emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
    emitByte(in_RDI,*(char *)(in_RSI + 1) * '\b' + -0x40 + *(char *)(in_RSI + 2));
  }
  return;
}

Assistant:

void JitCompilerX86::h_ISUB_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			emit(REX_SUB_RR);
			emitByte(0xc0 + 8 * instr.dst + instr.src);
		}
		else {
			emit(REX_81);
			emitByte(0xe8 + instr.dst);
			emit32(instr.getImm32());
		}
	}